

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

size_t caption_frame_dump_buffer(caption_frame_t *frame,utf8_char_t *buf)

{
  double dVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  caption_frame_cell_t *pcVar8;
  char *in_RSI;
  caption_frame_t *in_RDI;
  caption_frame_cell_t *cell_1;
  caption_frame_cell_t *cell;
  size_t total;
  size_t bytes;
  int c;
  int r;
  utf8_char_t *in_stack_ffffffffffffff88;
  utf8_char_t *in_stack_ffffffffffffff90;
  long local_28;
  int local_18;
  uint local_14;
  char *local_10;
  
  dVar1 = in_RDI->timestamp;
  cVar2 = (in_RDI->state).row;
  cVar3 = (in_RDI->state).col;
  uVar4 = caption_frame_rollup(in_RDI);
  iVar5 = sprintf(in_RSI,"   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",dVar1,
                  (ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3,(ulong)uVar4);
  iVar6 = sprintf(in_RSI + iVar5,
                  "   00000000001111111111222222222233\t   00000000001111111111222222222233\n   01234567890123456789012345678901\t   01234567890123456789012345678901\n  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_57,anon_var_dwarf_6b);
  local_28 = (long)iVar6 + (long)iVar5;
  local_10 = in_RSI + iVar5 + iVar6;
  for (local_14 = 0; (int)local_14 < 0xf; local_14 = local_14 + 1) {
    iVar5 = sprintf(local_10,"%02d%s",(ulong)local_14,"|");
    local_28 = iVar5 + local_28;
    local_10 = local_10 + iVar5;
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      frame_buffer_cell(&in_RDI->front,local_14,local_18);
      sVar7 = utf8_char_copy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_28 = sVar7 + local_28;
      local_10 = local_10 + sVar7;
    }
    iVar5 = sprintf(local_10,"%s\t%02d%s","|",(ulong)local_14);
    local_28 = iVar5 + local_28;
    local_10 = local_10 + iVar5;
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      pcVar8 = frame_buffer_cell(&in_RDI->back,local_14,local_18);
      if ((pcVar8 == (caption_frame_cell_t *)0x0) || (pcVar8->data[0] == '\0')) {
        in_stack_ffffffffffffff90 = " ";
      }
      else {
        in_stack_ffffffffffffff90 = pcVar8->data;
      }
      sVar7 = utf8_char_copy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_28 = sVar7 + local_28;
      local_10 = local_10 + sVar7;
    }
    iVar5 = sprintf(local_10,"%s\n","|");
    local_28 = iVar5 + local_28;
    local_10 = local_10 + iVar5;
  }
  iVar5 = sprintf(local_10,
                  "  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_61,anon_var_dwarf_75);
  return iVar5 + local_28;
}

Assistant:

size_t caption_frame_dump_buffer(caption_frame_t* frame, utf8_char_t* buf)
{
    int r, c;
    size_t bytes, total = 0;
    bytes = sprintf(buf, "   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",
        frame->timestamp, frame->state.row, frame->state.col, caption_frame_rollup(frame));
    total += bytes, buf += bytes;
    bytes = sprintf(buf, "   00000000001111111111222222222233\t   00000000001111111111222222222233\n"
                         "   01234567890123456789012345678901\t   01234567890123456789012345678901\n"
                         "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT);
    total += bytes;
    buf += bytes;

    for (r = 0; r < SCREEN_ROWS; ++r) {
        bytes = sprintf(buf, "%02d%s", r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // front buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\t%02d%s", EIA608_CHAR_VERTICAL_LINE, r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // back buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->back, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\n", EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;
    }

    bytes = sprintf(buf, "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT);
    total += bytes, buf += bytes;
    return total;
}